

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O3

void Ssw_ManSweepTransferDyn(Ssw_Man_t *p)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t *pAVar2;
  int iVar3;
  Aig_Man_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  int iFrame;
  long lVar6;
  
  pAVar4 = p->pAig;
  pVVar5 = pAVar4->vCis;
  if (0 < pVVar5->nSize) {
    lVar6 = 0;
    do {
      pAVar1 = (Aig_Obj_t *)pVVar5->pArray[lVar6];
      pAVar2 = p->pNodeToFrames[(long)pAVar1->Id * (long)p->nFrames];
      if (pAVar2 == (Aig_Obj_t *)((ulong)p->pFrames->pConst1 ^ 1)) {
        Ssw_SmlObjAssignConst(p->pSml,pAVar1,0,0);
      }
      else {
        if (((ulong)pAVar2 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObjFraig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                        ,0xe2,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
        }
        if ((*(uint *)&pAVar2->field_0x18 & 7) != 2) {
          __assert_fail("Aig_ObjIsCi(pObjFraig)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                        ,0xe3,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
        }
        iVar3 = (pAVar2->field_0).CioId;
        if (((long)iVar3 < 0) || (p->vSimInfo->nSize <= iVar3)) {
LAB_006a6344:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Ssw_SmlObjSetWord(p->pSml,pAVar1,*p->vSimInfo->pArray[iVar3],0,0);
      }
      lVar6 = lVar6 + 1;
      pAVar4 = p->pAig;
      pVVar5 = pAVar4->vCis;
    } while (lVar6 < pVVar5->nSize);
  }
  iVar3 = p->nFrames;
  iFrame = 1;
  if (1 < iVar3) {
    do {
      if (0 < pAVar4->nTruePis) {
        lVar6 = 0;
        do {
          if (pAVar4->vCis->nSize <= lVar6) goto LAB_006a6344;
          pAVar1 = (Aig_Obj_t *)pAVar4->vCis->pArray[lVar6];
          pAVar2 = p->pNodeToFrames[pAVar1->Id * p->nFrames + iFrame];
          if (((ulong)pAVar2 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObjFraig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                          ,0xed,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
          }
          if ((*(uint *)&pAVar2->field_0x18 & 7) != 2) {
            __assert_fail("Aig_ObjIsCi(pObjFraig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswDyn.c"
                          ,0xee,"void Ssw_ManSweepTransferDyn(Ssw_Man_t *)");
          }
          iVar3 = (pAVar2->field_0).CioId;
          if (((long)iVar3 < 0) || (p->vSimInfo->nSize <= iVar3)) goto LAB_006a6344;
          Ssw_SmlObjSetWord(p->pSml,pAVar1,*p->vSimInfo->pArray[iVar3],0,iFrame);
          lVar6 = lVar6 + 1;
          pAVar4 = p->pAig;
        } while (lVar6 < pAVar4->nTruePis);
        iVar3 = p->nFrames;
      }
      iFrame = iFrame + 1;
    } while (iFrame < iVar3);
  }
  iVar3 = Ssw_SmlNumFrames(p->pSml);
  if (iFrame < iVar3) {
    pAVar4 = p->pAig;
    do {
      if (0 < pAVar4->nTruePis) {
        lVar6 = 0;
        do {
          if (pAVar4->vCis->nSize <= lVar6) goto LAB_006a6344;
          Ssw_SmlAssignRandomFrame(p->pSml,(Aig_Obj_t *)pAVar4->vCis->pArray[lVar6],iFrame);
          lVar6 = lVar6 + 1;
          pAVar4 = p->pAig;
        } while (lVar6 < pAVar4->nTruePis);
      }
      iFrame = iFrame + 1;
    } while (iFrame != iVar3);
  }
  return;
}

Assistant:

void Ssw_ManSweepTransferDyn( Ssw_Man_t * p )
{
    Aig_Obj_t * pObj, * pObjFraig;
    unsigned * pInfo;
    int i, f, nFrames;

    // transfer simulation information
    Aig_ManForEachCi( p->pAig, pObj, i )
    {
        pObjFraig = Ssw_ObjFrame( p, pObj, 0 );
        if ( pObjFraig == Aig_ManConst0(p->pFrames) )
        {
            Ssw_SmlObjAssignConst( p->pSml, pObj, 0, 0 );
            continue;
        }
        assert( !Aig_IsComplement(pObjFraig) );
        assert( Aig_ObjIsCi(pObjFraig) );
        pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObjFraig) );
        Ssw_SmlObjSetWord( p->pSml, pObj, pInfo[0], 0, 0 );
    }
    // set random simulation info for the second frame
    for ( f = 1; f < p->nFrames; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
        {
            pObjFraig = Ssw_ObjFrame( p, pObj, f );
            assert( !Aig_IsComplement(pObjFraig) );
            assert( Aig_ObjIsCi(pObjFraig) );
            pInfo = (unsigned *)Vec_PtrEntry( p->vSimInfo, Aig_ObjCioId(pObjFraig) );
            Ssw_SmlObjSetWord( p->pSml, pObj, pInfo[0], 0, f );
        }
    }
    // create random info
    nFrames = Ssw_SmlNumFrames( p->pSml );
    for ( ; f < nFrames; f++ )
    {
        Saig_ManForEachPi( p->pAig, pObj, i )
            Ssw_SmlAssignRandomFrame( p->pSml, pObj, f );
    }
}